

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  pointer pTVar1;
  pointer pFVar2;
  long lVar3;
  pointer pTVar4;
  pointer pTVar5;
  Index IVar6;
  Result RVar7;
  int iVar8;
  Enum EVar10;
  uint keep;
  Location local_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  uint uVar9;
  
  pTVar1 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->module_->func_types).
           super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pFVar2[sig_index].params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>;
  pTVar4 = *(pointer *)
            ((long)&pFVar2[sig_index].params.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_> + 8);
  pTVar5 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar6 = SharedValidator::GetLocalCount(&this->validator_);
  local_e8.field_1.field_0.line = 0;
  local_e8.field_1._4_8_ = 0;
  local_e8.filename.data_ = (char *)0x0;
  local_e8.filename.size_._0_4_ = 0;
  local_e8.filename.size_._4_4_ = 0;
  Var::Var(&local_c0,sig_index,&local_e8);
  local_108.field_1.field_0.line = 0;
  local_108.field_1._4_8_ = 0;
  local_108.filename.data_ = (char *)0x0;
  local_108.filename.size_._0_4_ = 0;
  local_108.filename.size_._4_4_ = 0;
  Var::Var(&local_78,table_index,&local_108);
  RVar7 = SharedValidator::OnReturnCallIndirect
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_c0,&local_78);
  Var::~Var(&local_78);
  Var::~Var(&local_c0);
  EVar10 = Error;
  if (RVar7.enum_ != Error) {
    keep = (int)((ulong)((long)pTVar4 - lVar3) >> 2) + 1;
    EVar10 = Ok;
    uVar9 = (uint)((ulong)((long)pTVar5 - (long)pTVar1) >> 2);
    iVar8 = uVar9 - keep;
    if (uVar9 < keep) {
      iVar8 = 0;
    }
    Istream::EmitDropKeep(this->istream_,iVar8 + IVar6,keep);
    Istream::Emit(this->istream_,ReturnCallIndirect,table_index,sig_index);
  }
  return (Result)EVar10;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallIndirectExpr(Index sig_index,
                                                    Index table_index) {
  FuncType& func_type = module_.func_types[sig_index];

  Index drop_count, keep_count;
  // +1 to include the index of the function.
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, +1, &drop_count, &keep_count));
  // The validator must be run after we get the drop/keep counts, since it
  // changes the type stack.
  CHECK_RESULT(
      validator_.OnReturnCallIndirect(loc, Var(sig_index), Var(table_index)));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::ReturnCallIndirect, table_index, sig_index);
  return Result::Ok;
}